

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

_Bool nni_aio_expire_q_stop(nni_aio_expire_q *eq)

{
  int iVar1;
  _Bool local_11;
  _Bool result;
  nni_aio_expire_q *eq_local;
  
  local_11 = false;
  if (eq != (nni_aio_expire_q *)0x0) {
    nni_mtx_lock(&eq->eq_mtx);
    eq->eq_stop = true;
    nni_cv_wake(&eq->eq_cv);
    while( true ) {
      iVar1 = nni_list_empty(&eq->eq_list);
      if (iVar1 != 0) break;
      local_11 = true;
      nni_cv_wait(&eq->eq_cv);
    }
    nni_mtx_unlock(&eq->eq_mtx);
  }
  return local_11;
}

Assistant:

static bool
nni_aio_expire_q_stop(nni_aio_expire_q *eq)
{
	bool result = false;
	if (eq != NULL) {
		nni_mtx_lock(&eq->eq_mtx);
		eq->eq_stop = true;
		nni_cv_wake(&eq->eq_cv);
		while (!nni_list_empty(&eq->eq_list)) {
			result = true;
			nni_cv_wait(&eq->eq_cv);
		}
		nni_mtx_unlock(&eq->eq_mtx);
	}
	return (result);
}